

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String testing::internal::AppendUserMessage(String *gtest_msg,Message *user_msg)

{
  Message *pMVar1;
  size_t extraout_RDX;
  String SVar2;
  Message msg;
  String user_msg_string;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  String local_28;
  
  Message::GetString((Message *)&local_28);
  if ((local_28.c_str_ == (char *)0x0) || (local_28.length_ != 0)) {
    Message::Message((Message *)&local_30);
    pMVar1 = Message::operator<<((Message *)&local_30,(String *)user_msg);
    pMVar1 = Message::operator<<(pMVar1,(char (*) [2])0x17a706);
    Message::operator<<(pMVar1,&local_28);
    StringStreamToString((internal *)gtest_msg,local_30.ptr_);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  else {
    String::String(gtest_msg,(String *)user_msg);
  }
  String::~String(&local_28);
  SVar2.length_ = extraout_RDX;
  SVar2.c_str_ = (char *)gtest_msg;
  return SVar2;
}

Assistant:

String AppendUserMessage(const String& gtest_msg,
                         const Message& user_msg) {
  // Appends the user message if it's non-empty.
  const String user_msg_string = user_msg.GetString();
  if (user_msg_string.empty()) {
    return gtest_msg;
  }

  Message msg;
  msg << gtest_msg << "\n" << user_msg_string;

  return msg.GetString();
}